

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
::HashElement::operator()(HashElement *this,char (*key) [11])

{
  size_t sVar1;
  phmap_mix<8> *in_RSI;
  size_t *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff90;
  allocator local_39;
  string local_38 [56];
  
  sVar1 = *in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,(char *)in_RSI,&local_39);
  Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::operator()
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  sVar1 = phmap_mix<8>::operator()(in_RSI,sVar1);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return sVar1;
}

Assistant:

size_t operator()(const K& key, Args&&...) const
				{
					return phmap_mix<sizeof(size_t)>()(h(key));
				}